

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O1

int Abc_NodeMffcInside(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vInside)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar3 = vLeaves->nSize;
  if (0 < (long)iVar3) {
    ppvVar2 = vLeaves->pArray;
    lVar5 = 0;
    do {
      piVar1 = (int *)((long)ppvVar2[lVar5] + 0x2c);
      *piVar1 = *piVar1 + 1;
      lVar5 = lVar5 + 1;
    } while (iVar3 != lVar5);
  }
  iVar3 = Abc_NodeDeref_rec(pNode);
  Abc_NodeMffcConeSupp(pNode,vInside,(Vec_Ptr_t *)0x0);
  iVar4 = Abc_NodeRef_rec(pNode);
  if (iVar3 == iVar4) {
    iVar4 = vLeaves->nSize;
    if (0 < (long)iVar4) {
      ppvVar2 = vLeaves->pArray;
      lVar5 = 0;
      do {
        piVar1 = (int *)((long)ppvVar2[lVar5] + 0x2c);
        *piVar1 = *piVar1 + -1;
        lVar5 = lVar5 + 1;
      } while (iVar4 != lVar5);
    }
    return iVar3;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcRefs.c"
                ,0x16c,"int Abc_NodeMffcInside(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

int Abc_NodeMffcInside( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vInside )
{
    Abc_Obj_t * pObj;
    int i, Count1, Count2;
    // increment the fanout counters for the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->vFanouts.nSize++;
    // dereference the node
    Count1 = Abc_NodeDeref_rec( pNode );
    // collect the nodes inside the MFFC
    Abc_NodeMffcConeSupp( pNode, vInside, NULL );
    // reference it back
    Count2 = Abc_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    // remove the extra counters
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->vFanouts.nSize--;
    return Count1;
}